

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

int cmsys::anon_unknown_3::GetFieldsFromFile<long_long>
              (char *fileName,char **fieldNames,longlong *values)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  int *piVar4;
  char *pcVar5;
  istringstream *piVar6;
  long lVar7;
  long lVar8;
  char **ppcVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  istringstream is;
  allocator<char> local_4a1;
  char **local_4a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  long *local_480 [2];
  long local_470 [2];
  longlong *local_460;
  long *local_458 [2];
  long local_448 [2];
  istringstream local_438 [120];
  ios_base local_3c0 [912];
  
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a0 = fieldNames;
  local_460 = values;
  __stream = fopen(fileName,"r");
  iVar3 = -1;
  if (__stream != (FILE *)0x0) {
    iVar10 = 0;
    memset(local_438,0,0x400);
    iVar2 = feof(__stream);
    bVar14 = true;
    if (iVar2 == 0) {
      bVar14 = false;
LAB_0050ab8d:
      iVar2 = ferror(__stream);
      if (iVar2 == 0) {
        piVar4 = __errno_location();
        *piVar4 = 0;
        pcVar5 = fgets((char *)local_438,0x400,__stream);
        piVar6 = local_438;
        if (pcVar5 != (char *)0x0) {
          do {
            if (*piVar6 == (istringstream)0xa) {
              *piVar6 = (istringstream)0x0;
            }
            else if (*piVar6 == (istringstream)0x0) goto LAB_0050ac02;
            piVar6 = piVar6 + 1;
          } while( true );
        }
        iVar2 = ferror(__stream);
        if ((iVar2 != 0) && (*piVar4 == 4)) {
          clearerr(__stream);
        }
        iVar2 = feof(__stream);
        if (iVar2 == 0) goto LAB_0050ab8d;
      }
      bVar14 = iVar10 == 0;
    }
LAB_0050ac2b:
    iVar2 = ferror(__stream);
    fclose(__stream);
    if (!(bool)(iVar2 != 0 | bVar14)) {
      lVar12 = 0;
      ppcVar9 = local_4a0;
      do {
        if (ppcVar9[lVar12] == (char *)0x0) {
          iVar3 = 0;
          break;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_480,ppcVar9[lVar12],&local_4a1);
        bVar14 = (long)local_498.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_498.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start == 0;
        if (!bVar14) {
          uVar13 = (long)local_498.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_498.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          uVar11 = 0;
          lVar7 = std::__cxx11::string::find
                            ((char *)local_498.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,(ulong)local_480[0],0
                            );
          if (lVar7 == -1) {
            lVar7 = 0x20;
            uVar1 = 1;
            do {
              uVar11 = uVar1;
              if (uVar13 + (uVar13 == 0) == uVar11) {
                bVar14 = uVar13 <= uVar11;
                ppcVar9 = local_4a0;
                goto LAB_0050ad8b;
              }
              lVar8 = std::__cxx11::string::find
                                ((char *)((long)&((local_498.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar7),(ulong)local_480[0],0);
              lVar7 = lVar7 + 0x20;
              uVar1 = uVar11 + 1;
            } while (lVar8 == -1);
            bVar14 = uVar13 <= uVar11;
            ppcVar9 = local_4a0;
          }
          else {
            bVar14 = false;
          }
          std::__cxx11::string::substr
                    ((ulong)local_458,
                     (ulong)(local_498.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar11));
          std::__cxx11::istringstream::istringstream(local_438,(string *)local_458,_S_in);
          if (local_458[0] != local_448) {
            operator_delete(local_458[0],local_448[0] + 1);
          }
          std::istream::_M_extract<long_long>((longlong *)local_438);
          std::__cxx11::istringstream::~istringstream(local_438);
          std::ios_base::~ios_base(local_3c0);
        }
LAB_0050ad8b:
        if (local_480[0] != local_470) {
          operator_delete(local_480[0],local_470[0] + 1);
        }
        iVar3 = -2 - (int)lVar12;
        lVar12 = lVar12 + 1;
      } while (!bVar14);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_498);
  return iVar3;
LAB_0050ac02:
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char(&)[1024]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_498,
             (char (*) [1024])local_438);
  iVar10 = iVar10 + 1;
  iVar2 = feof(__stream);
  if (iVar2 != 0) goto LAB_0050ac2b;
  goto LAB_0050ab8d;
}

Assistant:

int GetFieldsFromFile(const char* fileName, const char** fieldNames, T* values)
{
  std::vector<std::string> fields;
  if (!LoadLines(fileName, fields)) {
    return -1;
  }
  int i = 0;
  while (fieldNames[i] != nullptr) {
    int ierr = NameValue(fields, fieldNames[i], values[i]);
    if (ierr) {
      return -(i + 2);
    }
    i += 1;
  }
  return 0;
}